

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

int __thiscall doctest::Context::run(Context *this)

{
  String *this_00;
  uint *puVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  ContextState *pCVar5;
  pointer pvVar6;
  const_iterator __position;
  pointer ppIVar7;
  TestCase *pTVar8;
  vector<doctest::String,_std::allocator<doctest::String>_> *filters;
  ContextState *pCVar9;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  __last;
  bool bVar10;
  char cVar11;
  bool bVar12;
  int iVar13;
  undefined1 *puVar14;
  char *pcVar15;
  _Base_ptr p_Var16;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  _Var17;
  size_t sVar18;
  char *__dest;
  const_iterator cVar19;
  long lVar20;
  int result;
  size_type sVar21;
  code *__comp;
  _Ios_Openmode _Var22;
  _Base_ptr name;
  byte bVar23;
  IReporter **curr;
  TestCase *name_00;
  pointer ppIVar24;
  IReporter **curr_rep;
  ulong uVar25;
  long in_FS_OFFSET;
  vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
  testArray;
  vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_> queryResults
  ;
  timeval t;
  stack_t sigStack;
  set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  testSuitesPassingFilt;
  fstream fstr;
  char local_389;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  local_378;
  __normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
  _Stack_370;
  long local_368;
  void *local_358;
  long lStack_350;
  long local_348;
  ContextState *local_340;
  anon_union_24_2_13149d16_for_String_3 local_338 [5];
  int local_2b0;
  TestCase **local_2a0;
  char *local_298;
  TestCase **local_290;
  sigaltstack local_288;
  _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  local_270;
  char local_240 [16];
  ostream local_230;
  
  pCVar9 = detail::g_cs;
  detail::g_cs = this->p;
  is_running_in_test = 1;
  pCVar5 = this->p;
  *(bool *)(in_FS_OFFSET + -0x38) = (pCVar5->super_ContextOptions).no_colors;
  (pCVar5->super_TestRunStats).numAsserts = 0;
  (pCVar5->super_TestRunStats).numAssertsFailed = 0;
  (pCVar5->super_CurrentTestCaseStats).numAssertsCurrentTest = 0;
  (pCVar5->super_CurrentTestCaseStats).numAssertsFailedCurrentTest = 0;
  (pCVar5->super_TestRunStats).numTestCases = 0;
  (pCVar5->super_TestRunStats).numTestCasesPassingFilters = 0;
  (pCVar5->super_TestRunStats).numTestSuitesPassingFilters = 0;
  (pCVar5->super_TestRunStats).numTestCasesFailed = 0;
  std::fstream::fstream(local_240);
  pCVar5 = this->p;
  if ((pCVar5->super_ContextOptions).cout == (ostream *)0x0) {
    if ((pCVar5->super_ContextOptions).quiet == true) {
      puVar14 = discardOut;
    }
    else {
      bVar23 = (pCVar5->super_ContextOptions).out.field_0.buf[0x17];
      if ((char)bVar23 < '\0') {
        sVar21 = (pCVar5->super_ContextOptions).out.field_0.data.size;
      }
      else {
        sVar21 = 0x17 - (bVar23 & 0x1f);
      }
      if (sVar21 != 0) {
        if ((char)bVar23 < '\0') {
          _Var22 = (_Ios_Openmode)*(undefined8 *)&(pCVar5->super_ContextOptions).out.field_0;
        }
        else {
          _Var22 = (int)pCVar5 + (_S_trunc|_S_in);
        }
        std::fstream::open(local_240,_Var22);
        (this->p->super_ContextOptions).cout = &local_230;
        goto LAB_0010abdb;
      }
      puVar14 = (undefined1 *)&std::cout;
    }
    (pCVar5->super_ContextOptions).cout = (ostream *)puVar14;
  }
LAB_0010abdb:
  (anonymous_namespace)::FatalConditionHandler::altStackMem =
       operator_new__((anonymous_namespace)::FatalConditionHandler::altStackSize);
  pvVar6 = (this->p->filters).
           super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar6[8].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
      super__Vector_impl_data._M_start ==
      pvVar6[8].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar15 = String::allocate((String *)local_338,7);
    builtin_strncpy(pcVar15,"console",7);
    std::vector<doctest::String,_std::allocator<doctest::String>_>::emplace_back<doctest::String>
              (pvVar6 + 8,(String *)local_338);
    if (((long)local_338[0]._16_8_ < 0) && ((TestCase *)local_338[0]._0_8_ != (TestCase *)0x0)) {
      operator_delete__((void *)local_338[0]._0_8_);
    }
  }
  local_340 = pCVar9;
  anon_unknown_15::getReporters();
  if ((_Rb_tree_header *)
      anon_unknown_15::getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &anon_unknown_15::getReporters::data._M_t._M_impl.super__Rb_tree_header) {
    p_Var16 = anon_unknown_15::getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    do {
      if (*(char *)((long)&p_Var16[1]._M_right + 7) < '\0') {
        name = p_Var16[1]._M_parent;
      }
      else {
        name = (_Base_ptr)&p_Var16[1]._M_parent;
      }
      pCVar5 = this->p;
      bVar10 = anon_unknown_15::matchesAny
                         ((char *)name,
                          (pCVar5->filters).
                          super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8,false,
                          (pCVar5->super_ContextOptions).case_sensitive);
      if (bVar10) {
        local_338[0]._0_8_ = (**(code **)(p_Var16 + 2))(detail::g_cs);
        std::vector<doctest::IReporter*,std::allocator<doctest::IReporter*>>::
        emplace_back<doctest::IReporter*>
                  ((vector<doctest::IReporter*,std::allocator<doctest::IReporter*>> *)
                   &pCVar5->reporters_currently_used,(IReporter **)local_338);
      }
      p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
    } while ((_Rb_tree_header *)p_Var16 !=
             &anon_unknown_15::getReporters::data._M_t._M_impl.super__Rb_tree_header);
  }
  anon_unknown_15::getListeners();
  if ((_Rb_tree_header *)
      anon_unknown_15::getListeners::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &anon_unknown_15::getListeners::data._M_t._M_impl.super__Rb_tree_header) {
    p_Var16 = anon_unknown_15::getListeners::data._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    do {
      pCVar5 = this->p;
      __position._M_current =
           (pCVar5->reporters_currently_used).
           super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_338[0]._0_8_ = (**(code **)(p_Var16 + 2))(detail::g_cs);
      std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::_M_insert_rval
                (&pCVar5->reporters_currently_used,__position,(value_type *)local_338);
      p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
    } while ((_Rb_tree_header *)p_Var16 !=
             &anon_unknown_15::getListeners::data._M_t._M_impl.super__Rb_tree_header);
  }
  pCVar5 = this->p;
  if (((((pCVar5->super_ContextOptions).no_run != false) ||
       ((pCVar5->super_ContextOptions).version != false)) ||
      ((pCVar5->super_ContextOptions).help != false)) ||
     ((pCVar5->super_ContextOptions).list_reporters == true)) {
    ppIVar24 = (detail::g_cs->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppIVar7 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar24 != ppIVar7) {
      do {
        local_338[0].data.ptr = (TestCase *)0x0;
        local_338[0]._8_8_ = (void *)0x0;
        local_338[0]._16_8_ = 0;
        (**(*ppIVar24)->_vptr_IReporter)(*ppIVar24,local_338);
        ppIVar24 = ppIVar24 + 1;
      } while (ppIVar24 != ppIVar7);
    }
    if ((anonymous_namespace)::FatalConditionHandler::altStackMem != (void *)0x0) {
      operator_delete__((anonymous_namespace)::FatalConditionHandler::altStackMem);
    }
    cVar11 = std::__basic_file<char>::is_open();
    pCVar5 = local_340;
    if (cVar11 != '\0') {
      std::fstream::close();
    }
    detail::g_cs = pCVar5;
    is_running_in_test = 0;
    ppIVar7 = (this->p->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar24 = (this->p->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppIVar24 != ppIVar7;
        ppIVar24 = ppIVar24 + 1) {
      if (*ppIVar24 != (IReporter *)0x0) {
        (*(*ppIVar24)->_vptr_IReporter[0xd])();
      }
    }
    pCVar5 = this->p;
    ppIVar24 = (pCVar5->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((pCVar5->reporters_currently_used).
        super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppIVar24) {
      (pCVar5->reporters_currently_used).
      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppIVar24;
    }
    if (((pCVar5->super_TestRunStats).numTestCasesFailed == 0) ||
       (iVar13 = 1, (pCVar5->super_ContextOptions).no_exitcode == true)) {
      iVar13 = 0;
    }
    goto LAB_0010ae3c;
  }
  local_378._M_current = (TestCase **)0x0;
  _Stack_370._M_current = (TestCase **)0x0;
  local_368 = 0;
  detail::getRegisteredTests();
  if ((_Rb_tree_header *)
      detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header) {
    p_Var16 = detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_338[0]._0_8_ = p_Var16 + 1;
      std::vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>
      ::emplace_back<doctest::detail::TestCase_const*>
                ((vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>
                  *)&local_378,(TestCase **)local_338);
      p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
    } while ((_Rb_tree_header *)p_Var16 !=
             &detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header);
  }
  __last._M_current = _Stack_370._M_current;
  _Var17._M_current = local_378._M_current;
  pCVar5 = this->p;
  (pCVar5->super_TestRunStats).numTestCases =
       (uint)((ulong)((long)_Stack_370._M_current - (long)local_378._M_current) >> 3);
  if (_Stack_370._M_current != local_378._M_current) {
    this_00 = &(pCVar5->super_ContextOptions).order_by;
    iVar13 = String::compare(this_00,"file",true);
    if (iVar13 == 0) {
      __comp = anon_unknown_15::fileOrderComparator;
    }
    else {
      iVar13 = String::compare(this_00,"suite",true);
      if (iVar13 == 0) {
        __comp = anon_unknown_15::suiteOrderComparator;
      }
      else {
        iVar13 = String::compare(this_00,"name",true);
        if (iVar13 != 0) {
          iVar13 = String::compare(this_00,"rand",true);
          if (iVar13 == 0) {
            srand((pCVar5->super_ContextOptions).rand_seed);
            _Var17._M_current = local_378._M_current;
            for (uVar25 = (long)_Stack_370._M_current - (long)local_378._M_current >> 3; uVar25 != 1
                ; uVar25 = uVar25 - 1) {
              iVar13 = rand();
              pTVar8 = _Var17._M_current[uVar25 - 1];
              iVar13 = (int)((ulong)(long)iVar13 % uVar25);
              _Var17._M_current[uVar25 - 1] = _Var17._M_current[iVar13];
              _Var17._M_current[iVar13] = pTVar8;
            }
          }
          goto LAB_0010afad;
        }
        __comp = anon_unknown_15::nameOrderComparator;
      }
    }
    std::
    sort<__gnu_cxx::__normal_iterator<doctest::detail::TestCase_const**,std::vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>>,bool(*)(doctest::detail::TestCase_const*,doctest::detail::TestCase_const*)>
              (_Var17,__last,__comp);
  }
LAB_0010afad:
  local_270._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_270._M_impl.super__Rb_tree_header._M_header;
  local_270._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_270._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_270._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar5 = this->p;
  local_389 = '\x01';
  if (((pCVar5->super_ContextOptions).count == false) &&
     ((pCVar5->super_ContextOptions).list_test_cases == false)) {
    local_389 = (pCVar5->super_ContextOptions).list_test_suites;
  }
  local_358 = (void *)0x0;
  lStack_350 = 0;
  local_348 = 0;
  local_270._M_impl.super__Rb_tree_header._M_header._M_right =
       local_270._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_389 == '\0') {
    ppIVar7 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar24 = (detail::g_cs->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppIVar24 != ppIVar7;
        ppIVar24 = ppIVar24 + 1) {
      (*(*ppIVar24)->_vptr_IReporter[1])();
    }
  }
  local_2a0 = _Stack_370._M_current;
  _Var17._M_current = local_378._M_current;
  if (local_378._M_current != _Stack_370._M_current) {
    do {
      pTVar8 = *_Var17._M_current;
      if ((pTVar8->super_TestCaseData).m_skip == true) {
        bVar23 = (this->p->super_ContextOptions).no_skip ^ 1;
      }
      else {
        bVar23 = 0;
      }
      name_00 = pTVar8;
      if ((pTVar8->super_TestCaseData).m_file.field_0.buf[0x17] < '\0') {
        name_00 = (TestCase *)(pTVar8->super_TestCaseData).m_file.field_0.data.ptr;
      }
      pCVar5 = this->p;
      filters = (pCVar5->filters).
                super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar10 = (pCVar5->super_ContextOptions).case_sensitive;
      local_290 = _Var17._M_current;
      bVar12 = anon_unknown_15::matchesAny((char *)name_00,filters,true,bVar10);
      if (!bVar12) {
        bVar23 = 1;
      }
      bVar12 = anon_unknown_15::matchesAny((char *)name_00,filters + 1,false,bVar10);
      if (bVar12) {
        bVar23 = 1;
      }
      pcVar15 = (pTVar8->super_TestCaseData).m_test_suite;
      bVar12 = anon_unknown_15::matchesAny(pcVar15,filters + 2,true,bVar10);
      if (!bVar12) {
        bVar23 = 1;
      }
      local_298 = pcVar15;
      bVar12 = anon_unknown_15::matchesAny(pcVar15,filters + 3,false,bVar10);
      if (bVar12) {
        bVar23 = 1;
      }
      pcVar15 = (pTVar8->super_TestCaseData).m_name;
      bVar12 = anon_unknown_15::matchesAny(pcVar15,filters + 4,true,bVar10);
      if (!bVar12) {
        bVar23 = 1;
      }
      bVar10 = anon_unknown_15::matchesAny(pcVar15,filters + 5,false,bVar10);
      pcVar15 = local_298;
      if (bVar10) {
        bVar23 = 1;
      }
      if ((bVar23 & 1) == 0) {
        puVar1 = &(pCVar5->super_TestRunStats).numTestCasesPassingFilters;
        *puVar1 = *puVar1 + 1;
      }
      uVar3 = (pCVar5->super_ContextOptions).last;
      uVar4 = (pCVar5->super_TestRunStats).numTestCasesPassingFilters;
      if (((uVar3 < uVar4) && ((pCVar5->super_ContextOptions).first <= uVar3)) ||
         (uVar4 < (pCVar5->super_ContextOptions).first)) {
        bVar23 = 1;
      }
      bVar10 = false;
      if ((bVar23 & 1) == 0) {
        if ((pCVar5->super_ContextOptions).count == false) {
          if ((pCVar5->super_ContextOptions).list_test_cases == true) {
            local_338[0]._0_8_ = pTVar8;
            std::vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>::
            emplace_back<doctest::TestCaseData_const*>
                      ((vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>
                        *)&local_358,(TestCaseData **)local_338);
          }
          else if ((pCVar5->super_ContextOptions).list_test_suites == true) {
            sVar18 = strlen(local_298);
            __dest = String::allocate((String *)local_338,(size_type)sVar18);
            memcpy(__dest,pcVar15,sVar18 & 0xffffffff);
            cVar19 = std::
                     _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                     ::find(&local_270,(String *)local_338);
            if ((_Rb_tree_header *)cVar19._M_node == &local_270._M_impl.super__Rb_tree_header) {
              cVar11 = *(pTVar8->super_TestCaseData).m_test_suite;
              if (((long)local_338[0]._16_8_ < 0) &&
                 ((TestCase *)local_338[0]._0_8_ != (TestCase *)0x0)) {
                operator_delete__((void *)local_338[0]._0_8_);
              }
              if (cVar11 != '\0') {
                local_338[0]._0_8_ = pTVar8;
                std::
                vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>::
                emplace_back<doctest::TestCaseData_const*>
                          ((vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>
                            *)&local_358,(TestCaseData **)local_338);
                String::String((String *)local_338,(pTVar8->super_TestCaseData).m_test_suite);
                std::
                _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                ::_M_insert_unique<doctest::String>(&local_270,(String *)local_338);
                if (((long)local_338[0]._16_8_ < 0) &&
                   ((TestCase *)local_338[0]._0_8_ != (TestCase *)0x0)) {
                  operator_delete__((void *)local_338[0]._0_8_);
                }
                puVar1 = &(this->p->super_TestRunStats).numTestSuitesPassingFilters;
                *puVar1 = *puVar1 + 1;
              }
            }
            else if (((long)local_338[0]._16_8_ < 0) &&
                    ((TestCase *)local_338[0]._0_8_ != (TestCase *)0x0)) {
              operator_delete__((void *)local_338[0]._0_8_);
            }
          }
          else {
            (pCVar5->super_ContextOptions).currentTest = pTVar8;
            (pCVar5->super_CurrentTestCaseStats).failure_flags = 0;
            (pCVar5->super_CurrentTestCaseStats).seconds = 0.0;
            lVar20 = 0;
            do {
              LOCK();
              pcVar15 = (pCVar5->numAssertsFailedCurrentTest_atomic).m_atomics[0].padding +
                        lVar20 + -4;
              pcVar15[0] = '\0';
              pcVar15[1] = '\0';
              pcVar15[2] = '\0';
              pcVar15[3] = '\0';
              UNLOCK();
              lVar20 = lVar20 + 0x40;
            } while (lVar20 != 0x800);
            pCVar5 = this->p;
            lVar20 = 0;
            do {
              LOCK();
              pcVar15 = (pCVar5->numAssertsCurrentTest_atomic).m_atomics[0].padding + lVar20 + -4;
              pcVar15[0] = '\0';
              pcVar15[1] = '\0';
              pcVar15[2] = '\0';
              pcVar15[3] = '\0';
              UNLOCK();
              lVar20 = lVar20 + 0x40;
            } while (lVar20 != 0x800);
            std::
            _Hashtable<unsigned_long_long,_unsigned_long_long,_std::allocator<unsigned_long_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long_long>,_std::hash<unsigned_long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::clear(&(this->p->fullyTraversedSubcases)._M_h);
            ppIVar7 = (detail::g_cs->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppIVar24 = (detail::g_cs->reporters_currently_used).
                            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppIVar24 != ppIVar7;
                ppIVar24 = ppIVar24 + 1) {
              (*(*ppIVar24)->_vptr_IReporter[3])();
            }
            pCVar5 = this->p;
            gettimeofday((timeval *)local_338,(__timezone_ptr_t)0x0);
            (pCVar5->timer).m_ticks =
                 (ticks_t)(local_338[0].data.ptr * 1000000 + local_338[0]._8_8_);
            bVar10 = true;
            do {
              pCVar5 = this->p;
              pCVar5->reachedLeaf = false;
              std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::
              _M_erase_at_end(&pCVar5->subcaseStack,
                              (pCVar5->subcaseStack).
                              super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                              ._M_impl.super__Vector_impl_data._M_start);
              pCVar5 = this->p;
              pCVar5->currentSubcaseDepth = 0;
              LOCK();
              (pCVar5->shouldLogCurrentException)._M_base._M_i = true;
              UNLOCK();
              std::vector<doctest::String,_std::allocator<doctest::String>_>::_M_erase_at_end
                        (&this->p->stringifiedContexts,
                         (this->p->stringifiedContexts).
                         super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
                         _M_impl.super__Vector_impl_data._M_start);
              (anonymous_namespace)::FatalConditionHandler::isSet = 1;
              local_288.ss_sp = (anonymous_namespace)::FatalConditionHandler::altStackMem;
              local_288.ss_size = (anonymous_namespace)::FatalConditionHandler::altStackSize;
              local_288.ss_flags = 0;
              sigaltstack(&local_288,
                          (sigaltstack *)(anonymous_namespace)::FatalConditionHandler::oldSigStack);
              memset((sigaction *)local_338,0,0x98);
              local_338[0].data.ptr = anon_unknown_15::FatalConditionHandler::handleSignal;
              local_2b0 = 0x8000000;
              puVar14 = (anonymous_namespace)::FatalConditionHandler::oldSigActions;
              lVar20 = 0;
              do {
                sigaction(*(int *)((long)&(anonymous_namespace)::signalDefs + lVar20),
                          (sigaction *)local_338,(sigaction *)puVar14);
                lVar20 = lVar20 + 0x10;
                puVar14 = (undefined1 *)((long)puVar14 + 0x98);
              } while (lVar20 != 0x60);
              (*pTVar8->m_test)();
              anon_unknown_15::FatalConditionHandler::reset();
              anon_unknown_15::FatalConditionHandler::reset();
              pCVar5 = this->p;
              if (0 < (pCVar5->super_ContextOptions).abort_after) {
                iVar13 = 0;
                lVar20 = 0;
                do {
                  iVar13 = iVar13 + *(int *)((pCVar5->numAssertsFailedCurrentTest_atomic).m_atomics
                                             [0].padding + lVar20 + -4);
                  lVar20 = lVar20 + 0x40;
                } while (lVar20 != 0x800);
                if ((this->p->super_ContextOptions).abort_after <=
                    iVar13 + (pCVar5->super_TestRunStats).numAssertsFailed) {
                  piVar2 = &(this->p->super_CurrentTestCaseStats).failure_flags;
                  *(byte *)piVar2 = (byte)*piVar2 | 8;
                  bVar10 = false;
                }
              }
              if (((this->p->nextSubcaseStack).
                   super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                   (this->p->nextSubcaseStack).
                   super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                   ._M_impl.super__Vector_impl_data._M_finish) && (bVar10)) {
                ppIVar7 = (detail::g_cs->reporters_currently_used).
                          super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                for (ppIVar24 = (detail::g_cs->reporters_currently_used).
                                super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                                ._M_impl.super__Vector_impl_data._M_start; ppIVar24 != ppIVar7;
                    ppIVar24 = ppIVar24 + 1) {
                  (*(*ppIVar24)->_vptr_IReporter[4])(*ppIVar24,pTVar8);
                }
              }
              pCVar5 = this->p;
              if ((pCVar5->nextSubcaseStack).
                  super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  (pCVar5->nextSubcaseStack).
                  super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                bVar10 = false;
              }
            } while (bVar10);
            detail::ContextState::finalizeTestCaseData(pCVar5);
            ppIVar7 = (detail::g_cs->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppIVar24 = (detail::g_cs->reporters_currently_used).
                            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppIVar24 != ppIVar7;
                ppIVar24 = ppIVar24 + 1) {
              (*(*ppIVar24)->_vptr_IReporter[5])
                        (*ppIVar24,&detail::g_cs->super_CurrentTestCaseStats);
            }
            pCVar5 = this->p;
            (pCVar5->super_ContextOptions).currentTest = (TestCase *)0x0;
            iVar13 = (pCVar5->super_ContextOptions).abort_after;
            if ((iVar13 < 1) ||
               (bVar10 = true, (pCVar5->super_TestRunStats).numAssertsFailed < iVar13)) {
              bVar10 = false;
            }
          }
        }
      }
      else if (local_389 == '\0') {
        ppIVar7 = (detail::g_cs->reporters_currently_used).
                  super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppIVar24 = (detail::g_cs->reporters_currently_used).
                        super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppIVar24 != ppIVar7;
            ppIVar24 = ppIVar24 + 1) {
          (*(*ppIVar24)->_vptr_IReporter[0xb])(*ppIVar24,pTVar8);
        }
      }
    } while ((!bVar10) && (_Var17._M_current = local_290 + 1, local_290 + 1 != local_2a0));
  }
  if (local_389 == '\0') {
    ppIVar7 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar24 = (detail::g_cs->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppIVar24 != ppIVar7;
        ppIVar24 = ppIVar24 + 1) {
      (*(*ppIVar24)->_vptr_IReporter[2])(*ppIVar24,&detail::g_cs->super_TestRunStats);
    }
  }
  else {
    local_338[0]._0_8_ = &detail::g_cs->super_TestRunStats;
    if (detail::g_cs == (ContextState *)0x0) {
      local_338[0]._0_8_ = (TestCase *)0x0;
    }
    local_338[0]._8_8_ = local_358;
    local_338[0]._16_4_ = (int)((ulong)(lStack_350 - (long)local_358) >> 3);
    ppIVar24 = (detail::g_cs->reporters_currently_used).
               super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppIVar7 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar24 != ppIVar7) {
      do {
        (**(*ppIVar24)->_vptr_IReporter)(*ppIVar24,local_338);
        ppIVar24 = ppIVar24 + 1;
      } while (ppIVar24 != ppIVar7);
    }
  }
  if ((anonymous_namespace)::FatalConditionHandler::altStackMem != (void *)0x0) {
    operator_delete__((anonymous_namespace)::FatalConditionHandler::altStackMem);
  }
  cVar11 = std::__basic_file<char>::is_open();
  pCVar5 = local_340;
  if (cVar11 != '\0') {
    std::fstream::close();
  }
  detail::g_cs = pCVar5;
  is_running_in_test = 0;
  ppIVar7 = (this->p->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar24 = (this->p->reporters_currently_used).
                  super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppIVar24 != ppIVar7;
      ppIVar24 = ppIVar24 + 1) {
    if (*ppIVar24 != (IReporter *)0x0) {
      (*(*ppIVar24)->_vptr_IReporter[0xd])();
    }
  }
  pCVar5 = this->p;
  ppIVar24 = (pCVar5->reporters_currently_used).
             super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  if ((pCVar5->reporters_currently_used).
      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppIVar24) {
    (pCVar5->reporters_currently_used).
    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppIVar24;
  }
  if (((pCVar5->super_TestRunStats).numTestCasesFailed == 0) ||
     (iVar13 = 1, (pCVar5->super_ContextOptions).no_exitcode == true)) {
    iVar13 = 0;
  }
  if (local_358 != (void *)0x0) {
    operator_delete(local_358,local_348 - (long)local_358);
  }
  std::
  _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  ::~_Rb_tree(&local_270);
  if (local_378._M_current != (TestCase **)0x0) {
    operator_delete(local_378._M_current,local_368 - (long)local_378._M_current);
  }
LAB_0010ae3c:
  std::fstream::~fstream(local_240);
  return iVar13;
}

Assistant:

int Context::run() {
    using namespace detail;

    // save the old context state in case such was setup - for using asserts out of a testing context
    auto old_cs = g_cs;
    // this is the current contest
    g_cs               = p;
    is_running_in_test = true;

    g_no_colors = p->no_colors;
    p->resetRunData();

    std::fstream fstr;
    if(p->cout == nullptr) {
        if(p->quiet) {
            p->cout = &discardOut;
        } else if(p->out.size()) {
            // to a file if specified
            fstr.open(p->out.c_str(), std::fstream::out);
            p->cout = &fstr;
        } else {
            // stdout by default
            p->cout = &std::cout;
        }
    }

    FatalConditionHandler::allocateAltStackMem();

    auto cleanup_and_return = [&]() {
        FatalConditionHandler::freeAltStackMem();

        if(fstr.is_open())
            fstr.close();

        // restore context
        g_cs               = old_cs;
        is_running_in_test = false;

        // we have to free the reporters which were allocated when the run started
        for(auto& curr : p->reporters_currently_used)
            delete curr;
        p->reporters_currently_used.clear();

        if(p->numTestCasesFailed && !p->no_exitcode)
            return EXIT_FAILURE;
        return EXIT_SUCCESS;
    };

    // setup default reporter if none is given through the command line
    if(p->filters[8].empty())
        p->filters[8].push_back("console");

    // check to see if any of the registered reporters has been selected
    for(auto& curr : getReporters()) {
        if(matchesAny(curr.first.second.c_str(), p->filters[8], false, p->case_sensitive))
            p->reporters_currently_used.push_back(curr.second(*g_cs));
    }

    // TODO: check if there is nothing in reporters_currently_used

    // prepend all listeners
    for(auto& curr : getListeners())
        p->reporters_currently_used.insert(p->reporters_currently_used.begin(), curr.second(*g_cs));

#ifdef DOCTEST_PLATFORM_WINDOWS
    if(isDebuggerActive() && p->no_debug_output == false)
        p->reporters_currently_used.push_back(new DebugOutputWindowReporter(*g_cs));
#endif // DOCTEST_PLATFORM_WINDOWS

    // handle version, help and no_run
    if(p->no_run || p->version || p->help || p->list_reporters) {
        DOCTEST_ITERATE_THROUGH_REPORTERS(report_query, QueryData());

        return cleanup_and_return();
    }

    std::vector<const TestCase*> testArray;
    for(auto& curr : getRegisteredTests())
        testArray.push_back(&curr);
    p->numTestCases = testArray.size();

    // sort the collected records
    if(!testArray.empty()) {
        if(p->order_by.compare("file", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), fileOrderComparator);
        } else if(p->order_by.compare("suite", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), suiteOrderComparator);
        } else if(p->order_by.compare("name", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), nameOrderComparator);
        } else if(p->order_by.compare("rand", true) == 0) {
            std::srand(p->rand_seed);

            // random_shuffle implementation
            const auto first = &testArray[0];
            for(size_t i = testArray.size() - 1; i > 0; --i) {
                int idxToSwap = std::rand() % (i + 1);

                const auto temp = first[i];

                first[i]         = first[idxToSwap];
                first[idxToSwap] = temp;
            }
        } else if(p->order_by.compare("none", true) == 0) {
            // means no sorting - beneficial for death tests which call into the executable
            // with a specific test case in mind - we don't want to slow down the startup times
        }
    }

    std::set<String> testSuitesPassingFilt;

    bool                             query_mode = p->count || p->list_test_cases || p->list_test_suites;
    std::vector<const TestCaseData*> queryResults;

    if(!query_mode)
        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_start, DOCTEST_EMPTY);

    // invoke the registered functions if they match the filter criteria (or just count them)
    for(auto& curr : testArray) {
        const auto& tc = *curr;

        bool skip_me = false;
        if(tc.m_skip && !p->no_skip)
            skip_me = true;

        if(!matchesAny(tc.m_file.c_str(), p->filters[0], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_file.c_str(), p->filters[1], false, p->case_sensitive))
            skip_me = true;
        if(!matchesAny(tc.m_test_suite, p->filters[2], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_test_suite, p->filters[3], false, p->case_sensitive))
            skip_me = true;
        if(!matchesAny(tc.m_name, p->filters[4], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_name, p->filters[5], false, p->case_sensitive))
            skip_me = true;

        if(!skip_me)
            p->numTestCasesPassingFilters++;

        // skip the test if it is not in the execution range
        if((p->last < p->numTestCasesPassingFilters && p->first <= p->last) ||
           (p->first > p->numTestCasesPassingFilters))
            skip_me = true;

        if(skip_me) {
            if(!query_mode)
                DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_skipped, tc);
            continue;
        }

        // do not execute the test if we are to only count the number of filter passing tests
        if(p->count)
            continue;

        // print the name of the test and don't execute it
        if(p->list_test_cases) {
            queryResults.push_back(&tc);
            continue;
        }

        // print the name of the test suite if not done already and don't execute it
        if(p->list_test_suites) {
            if((testSuitesPassingFilt.count(tc.m_test_suite) == 0) && tc.m_test_suite[0] != '\0') {
                queryResults.push_back(&tc);
                testSuitesPassingFilt.insert(tc.m_test_suite);
                p->numTestSuitesPassingFilters++;
            }
            continue;
        }

        // execute the test if it passes all the filtering
        {
            p->currentTest = &tc;

            p->failure_flags = TestCaseFailureReason::None;
            p->seconds       = 0;

            // reset atomic counters
            p->numAssertsFailedCurrentTest_atomic = 0;
            p->numAssertsCurrentTest_atomic       = 0;

            p->fullyTraversedSubcases.clear();

            DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_start, tc);

            p->timer.start();
            
            bool run_test = true;

            do {
                // reset some of the fields for subcases (except for the set of fully passed ones)
                p->reachedLeaf = false;
                // May not be empty if previous subcase exited via exception.
                p->subcaseStack.clear();
                p->currentSubcaseDepth = 0;

                p->shouldLogCurrentException = true;

                // reset stuff for logging with INFO()
                p->stringifiedContexts.clear();

#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
                try {
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS
// MSVC 2015 diagnoses fatalConditionHandler as unused (because reset() is a static method)
DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4101) // unreferenced local variable
                    FatalConditionHandler fatalConditionHandler; // Handle signals
                    // execute the test
                    tc.m_test();
                    fatalConditionHandler.reset();
DOCTEST_MSVC_SUPPRESS_WARNING_POP
#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
                } catch(const TestFailureException&) {
                    p->failure_flags |= TestCaseFailureReason::AssertFailure;
                } catch(...) {
                    DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_exception,
                                                      {translateActiveException(), false});
                    p->failure_flags |= TestCaseFailureReason::Exception;
                }
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS

                // exit this loop if enough assertions have failed - even if there are more subcases
                if(p->abort_after > 0 &&
                   p->numAssertsFailed + p->numAssertsFailedCurrentTest_atomic >= p->abort_after) {
                    run_test = false;
                    p->failure_flags |= TestCaseFailureReason::TooManyFailedAsserts;
                }
                
                if(!p->nextSubcaseStack.empty() && run_test)
                    DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_reenter, tc);
                if(p->nextSubcaseStack.empty())
                    run_test = false;
            } while(run_test);

            p->finalizeTestCaseData();

            DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_end, *g_cs);

            p->currentTest = nullptr;

            // stop executing tests if enough assertions have failed
            if(p->abort_after > 0 && p->numAssertsFailed >= p->abort_after)
                break;
        }
    }

    if(!query_mode) {
        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_end, *g_cs);
    } else {
        QueryData qdata;
        qdata.run_stats = g_cs;
        qdata.data      = queryResults.data();
        qdata.num_data  = unsigned(queryResults.size());
        DOCTEST_ITERATE_THROUGH_REPORTERS(report_query, qdata);
    }

    return cleanup_and_return();
}